

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregoimp.cpp
# Opt level: O2

double icu_63::Grego::fieldsToDay(int32_t year,int32_t month,int32_t dom)

{
  UBool UVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  uVar2 = year - 1;
  if (year < 1) {
    uVar3 = -year;
    iVar5 = (~(uVar3 / 400) - (uVar3 >> 2)) + uVar2 * 0x16d + 0x1a444e;
    uVar2 = ~(uVar3 / 100);
  }
  else {
    iVar5 = uVar2 / 400 + (uVar2 >> 2) + uVar2 * 0x16d + 0x1a444f;
    uVar2 = uVar2 / 100;
  }
  UVar1 = isLeapYear(year);
  iVar4 = month + 0xc;
  if (UVar1 == '\0') {
    iVar4 = month;
  }
  return (double)(int)((int)*(short *)(DAYS_BEFORE + (long)iVar4 * 2) + ((dom + iVar5) - uVar2) + 2)
         + -2440588.0;
}

Assistant:

double Grego::fieldsToDay(int32_t year, int32_t month, int32_t dom) {

    int32_t y = year - 1;

    double julian = 365 * y + ClockMath::floorDivide(y, 4) + (JULIAN_1_CE - 3) + // Julian cal
        ClockMath::floorDivide(y, 400) - ClockMath::floorDivide(y, 100) + 2 + // => Gregorian cal
        DAYS_BEFORE[month + (isLeapYear(year) ? 12 : 0)] + dom; // => month/dom

    return julian - JULIAN_1970_CE; // JD => epoch day
}